

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_FullRHS(void *arkode_mem,realtype t,N_Vector y,N_Vector f,int mode)

{
  int iVar1;
  uint in_ECX;
  MRIStepInnerStepper in_RDX;
  undefined8 in_RSI;
  ARKodeMem in_XMM0_Qa;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  N_Vector in_stack_ffffffffffffffc0;
  ARKodeMem in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  
  iVar1 = mriStep_AccessStepMem
                    (in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                     (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (ARKodeMRIStepMem *)0x11550c8);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (in_ECX == 0) {
    uVar2 = in_ECX;
    if (*(int *)&in_stack_ffffffffffffffc0[1].content != 0) {
      iVar1 = (*(code *)in_stack_ffffffffffffffc0->content)
                        (in_XMM0_Qa,in_RSI,(in_stack_ffffffffffffffc0[1].sunctx)->profiler,
                         in_stack_ffffffffffffffc8->user_data);
      in_stack_ffffffffffffffc0[0xf].content =
           (void *)((long)in_stack_ffffffffffffffc0[0xf].content + 1);
      if (iVar1 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,
                        "ARKode::MRIStep","mriStep_FullRHS",
                        "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
    }
    if (*(int *)((long)&in_stack_ffffffffffffffc0[1].content + 4) != 0) {
      iVar1 = (*(code *)in_stack_ffffffffffffffc0->ops)
                        (in_XMM0_Qa,in_RSI,*in_stack_ffffffffffffffc0[2].content,
                         in_stack_ffffffffffffffc8->user_data);
      in_stack_ffffffffffffffc0[0xf].ops =
           (N_Vector_Ops)((long)&(in_stack_ffffffffffffffc0[0xf].ops)->nvgetvectorid + 1);
      if (iVar1 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,
                        "ARKode::MRIStep","mriStep_FullRHS",
                        "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
    }
    iVar1 = mriStepInnerStepper_FullRhs
                      (in_RDX,(realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                       (N_Vector)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,0);
    if (iVar1 != 0) {
      arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,"ARKode::MRIStep"
                      ,"mriStep_FullRHS",
                      "At t = %lg, the right-hand side routine failed in an unrecoverable manner.");
      return -8;
    }
    if ((*(int *)&in_stack_ffffffffffffffc0[1].content == 0) ||
       (*(int *)((long)&in_stack_ffffffffffffffc0[1].content + 4) == 0)) {
      if (*(int *)((long)&in_stack_ffffffffffffffc0[1].content + 4) == 0) {
        N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                     (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                     (N_Vector)(ulong)in_ECX,(N_Vector)0x1155360);
      }
      else {
        N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                     (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                     (N_Vector)(ulong)in_ECX,(N_Vector)0x1155338);
      }
    }
    else {
      N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                   (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                   (N_Vector)(ulong)in_ECX,(N_Vector)0x11552df);
      N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                   (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                   (N_Vector)CONCAT44(iVar1,in_ECX),(N_Vector)0x1155305);
    }
  }
  else if (in_ECX == 1) {
    uVar2 = in_ECX;
    if (*(int *)&in_stack_ffffffffffffffc0[1].content != 0) {
      iVar1 = (*(code *)in_stack_ffffffffffffffc0->content)
                        (in_XMM0_Qa,in_RSI,(in_stack_ffffffffffffffc0[1].sunctx)->profiler,
                         in_stack_ffffffffffffffc8->user_data);
      in_stack_ffffffffffffffc0[0xf].content =
           (void *)((long)in_stack_ffffffffffffffc0[0xf].content + 1);
      if (iVar1 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,
                        "ARKode::MRIStep","mriStep_FullRHS",
                        "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
    }
    if (*(int *)((long)&in_stack_ffffffffffffffc0[1].content + 4) != 0) {
      iVar1 = (*(code *)in_stack_ffffffffffffffc0->ops)
                        (in_XMM0_Qa,in_RSI,*in_stack_ffffffffffffffc0[2].content,
                         in_stack_ffffffffffffffc8->user_data);
      in_stack_ffffffffffffffc0[0xf].ops =
           (N_Vector_Ops)((long)&(in_stack_ffffffffffffffc0[0xf].ops)->nvgetvectorid + 1);
      if (iVar1 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,
                        "ARKode::MRIStep","mriStep_FullRHS",
                        "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
    }
    iVar1 = mriStepInnerStepper_FullRhs
                      (in_RDX,(realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                       (N_Vector)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,0);
    if (iVar1 != 0) {
      arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,"ARKode::MRIStep"
                      ,"mriStep_FullRHS",
                      "At t = %lg, the right-hand side routine failed in an unrecoverable manner.");
      return -8;
    }
    if ((*(int *)&in_stack_ffffffffffffffc0[1].content == 0) ||
       (*(int *)((long)&in_stack_ffffffffffffffc0[1].content + 4) == 0)) {
      if (*(int *)((long)&in_stack_ffffffffffffffc0[1].content + 4) == 0) {
        N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                     (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                     (N_Vector)(ulong)in_ECX,(N_Vector)0x11555bb);
      }
      else {
        N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                     (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                     (N_Vector)(ulong)in_ECX,(N_Vector)0x1155593);
      }
    }
    else {
      N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                   (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                   (N_Vector)(ulong)in_ECX,(N_Vector)0x115553a);
      N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                   (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                   (N_Vector)CONCAT44(iVar1,in_ECX),(N_Vector)0x1155560);
    }
  }
  else {
    if (in_ECX != 2) {
      arkProcessError(in_stack_ffffffffffffffc8,-8,"ARKode::MRIStep","mriStep_FullRHS",
                      "Unknown full RHS mode");
      return -8;
    }
    uVar2 = in_ECX;
    if (*(int *)&in_stack_ffffffffffffffc0[1].content != 0) {
      iVar1 = (*(code *)in_stack_ffffffffffffffc0->content)
                        (in_XMM0_Qa,in_RSI,in_stack_ffffffffffffffc8->tempv2,
                         in_stack_ffffffffffffffc8->user_data);
      in_stack_ffffffffffffffc0[0xf].content =
           (void *)((long)in_stack_ffffffffffffffc0[0xf].content + 1);
      if (iVar1 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,
                        "ARKode::MRIStep","mriStep_FullRHS",
                        "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
    }
    if (*(int *)((long)&in_stack_ffffffffffffffc0[1].content + 4) != 0) {
      iVar1 = (*(code *)in_stack_ffffffffffffffc0->ops)
                        (in_XMM0_Qa,in_RSI,in_stack_ffffffffffffffc0[4].sunctx,
                         in_stack_ffffffffffffffc8->user_data);
      in_stack_ffffffffffffffc0[0xf].ops =
           (N_Vector_Ops)((long)&(in_stack_ffffffffffffffc0[0xf].ops)->nvgetvectorid + 1);
      if (iVar1 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,
                        "ARKode::MRIStep","mriStep_FullRHS",
                        "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
    }
    iVar1 = mriStepInnerStepper_FullRhs
                      (in_RDX,(realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                       (N_Vector)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,0);
    if (iVar1 != 0) {
      arkProcessError(in_XMM0_Qa,(int)in_stack_ffffffffffffffc8,(char *)0xfffffff8,"ARKode::MRIStep"
                      ,"mriStep_FullRHS",
                      "At t = %lg, the right-hand side routine failed in an unrecoverable manner.");
      return -8;
    }
    if ((*(int *)&in_stack_ffffffffffffffc0[1].content == 0) ||
       (*(int *)((long)&in_stack_ffffffffffffffc0[1].content + 4) == 0)) {
      if (*(int *)((long)&in_stack_ffffffffffffffc0[1].content + 4) == 0) {
        N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                     (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                     (N_Vector)(ulong)in_ECX,(N_Vector)0x115580d);
      }
      else {
        N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                     (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                     (N_Vector)(ulong)in_ECX,(N_Vector)0x11557e5);
      }
    }
    else {
      N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                   (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                   (N_Vector)(ulong)in_ECX,(N_Vector)0x1155792);
      N_VLinearSum((realtype)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                   (N_Vector)in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                   (N_Vector)CONCAT44(iVar1,in_ECX),(N_Vector)0x11557b5);
    }
  }
  return 0;
}

Assistant:

int mriStep_FullRHS(void* arkode_mem, realtype t, N_Vector y, N_Vector f,
                    int mode)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_FullRHS",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* perform RHS functions contingent on 'mode' argument */
  switch(mode) {

  /* ARK_FULLRHS_START: called at the beginning of a simulation
     Store the vector fs(t,y) in F[0] for possible reuse
     in the first stage of the subsequent time step */
  case ARK_FULLRHS_START:

    /* call fse if the problem has an explicit component */
    if (step_mem->explicit_rhs) {
      retval = step_mem->fse(t, y, step_mem->Fse[0], ark_mem->user_data);
      step_mem->nfse++;
      if (retval != 0) {
         arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                         "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
         return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call fsi if the problem has an implicit component */
    if (step_mem->implicit_rhs) {
      retval = step_mem->fsi(t, y, step_mem->Fsi[0], ark_mem->user_data);
      step_mem->nfsi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call ff (force new RHS computation) */
    retval = mriStepInnerStepper_FullRhs(step_mem->stepper, t, y, f,
                                         ARK_FULLRHS_OTHER);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                      "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    /* combine RHS vectors into output */
    if (step_mem->explicit_rhs && step_mem->implicit_rhs) { /* ImEx */
      N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
    } else {
      if (step_mem->implicit_rhs) {         /* implicit */
        N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
      } else {                          /* explicit */
        N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      }
    }

    break;


  /* ARK_FULLRHS_END: called at the end of a successful step
     This always recomputes the full RHS (i.e., this is the
     same as case 0). */
  case ARK_FULLRHS_END:

    /* call fse if the problem has an explicit component */
    if (step_mem->explicit_rhs) {
      retval = step_mem->fse(t, y, step_mem->Fse[0], ark_mem->user_data);
      step_mem->nfse++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call fsi if the problem has an implicit component */
    if (step_mem->implicit_rhs) {
      retval = step_mem->fsi(t, y, step_mem->Fsi[0], ark_mem->user_data);
      step_mem->nfsi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call ff (force new RHS computation) */
    retval = mriStepInnerStepper_FullRhs(step_mem->stepper, t, y, f,
                                         ARK_FULLRHS_OTHER);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                      "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    /* combine RHS vectors into output */
    if (step_mem->explicit_rhs && step_mem->implicit_rhs) { /* ImEx */
      N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
    } else {
      if (step_mem->implicit_rhs) {         /* implicit */
        N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
      } else {                          /* explicit */
        N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      }
    }
    break;

  /*  ARK_FULLRHS_OTHER: called for dense output in-between steps
      store the intermediate calculations in such a way as to not
      interfere with the other two modes */
  case ARK_FULLRHS_OTHER:

    /* call fse if the problem has an explicit component (store in ark_tempv2) */
    if (step_mem->explicit_rhs) {
      retval = step_mem->fse(t, y, ark_mem->tempv2, ark_mem->user_data);
      step_mem->nfse++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call fsi if the problem has an implicit component (store in sdata) */
    if (step_mem->implicit_rhs) {
      retval = step_mem->fsi(t, y, step_mem->sdata, ark_mem->user_data);
      step_mem->nfsi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }


    /* call ff (force new RHS computation) */
    retval = mriStepInnerStepper_FullRhs(step_mem->stepper, t, y, f,
                                         ARK_FULLRHS_OTHER);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                      "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    /* combine RHS vectors into output */
    if (step_mem->explicit_rhs && step_mem->implicit_rhs) { /* ImEx */
      N_VLinearSum(ONE, ark_mem->tempv2, ONE, f, f);
      N_VLinearSum(ONE, step_mem->sdata, ONE, f, f);
    } else {                   /* implicit */
      if (step_mem->implicit_rhs) {
        N_VLinearSum(ONE, step_mem->sdata, ONE, f, f);
      } else {                                           /* explicit */
        N_VLinearSum(ONE, ark_mem->tempv2, ONE, f, f);
      }
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                    "mriStep_FullRHS", "Unknown full RHS mode");
    return(ARK_RHSFUNC_FAIL);
  }

  return(ARK_SUCCESS);
}